

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

uint __thiscall
CBlockPolicyEstimator::HighestTargetTracked(CBlockPolicyEstimator *this,FeeEstimateHorizon horizon)

{
  long lVar1;
  int in_ESI;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock4;
  TxConfirmStats *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffbb;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff98);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_RDI,(AnnotatedMixin<std::mutex> *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,
             (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc,(bool)in_stack_ffffffffffffffbb);
  if (in_ESI == 0) {
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               in_stack_ffffffffffffff98);
    local_1c = TxConfirmStats::GetMaxConfirms(in_stack_ffffffffffffff98);
  }
  else if (in_ESI == 1) {
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               in_stack_ffffffffffffff98);
    local_1c = TxConfirmStats::GetMaxConfirms(in_stack_ffffffffffffff98);
  }
  else {
    if (in_ESI != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                    ,0x305,
                    "unsigned int CBlockPolicyEstimator::HighestTargetTracked(FeeEstimateHorizon) const"
                   );
    }
    std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
              ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
               in_stack_ffffffffffffff98);
    local_1c = TxConfirmStats::GetMaxConfirms(in_stack_ffffffffffffff98);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int CBlockPolicyEstimator::HighestTargetTracked(FeeEstimateHorizon horizon) const
{
    LOCK(m_cs_fee_estimator);
    switch (horizon) {
    case FeeEstimateHorizon::SHORT_HALFLIFE: {
        return shortStats->GetMaxConfirms();
    }
    case FeeEstimateHorizon::MED_HALFLIFE: {
        return feeStats->GetMaxConfirms();
    }
    case FeeEstimateHorizon::LONG_HALFLIFE: {
        return longStats->GetMaxConfirms();
    }
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}